

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,
          vector<signed_char,_std::allocator<signed_char>_> *complementation,double rhs,
          HighsInt nbin,vector<int,_std::allocator<int>_> *perm,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          double feastol)

{
  double *pdVar1;
  HighsMipSolverData *pHVar2;
  pointer piVar3;
  pointer pcVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  pointer pCVar5;
  pointer pdVar6;
  CliqueVar *cliquevars;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int *piVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  HighsInt j;
  long lVar17;
  int *piVar18;
  int *piVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  char cVar23;
  int iVar26;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar27;
  ulong in_XMM1_Qb;
  double dVar28;
  double dVar29;
  double dVar30;
  int iVar31;
  int iVar34;
  undefined1 auVar33 [16];
  double dVar35;
  HighsCDouble local_100;
  ulong local_f0;
  anon_class_8_1_8992ca70 local_e8;
  int local_dc;
  double local_d8;
  vector<signed_char,_std::allocator<signed_char>_> *local_d0;
  double local_c8;
  ulong uStack_c0;
  ulong local_b0;
  HighsMipSolver *local_a8;
  HighsCliqueTable *local_a0;
  HighsImplications *local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  ulong local_88;
  long local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  undefined1 auVar32 [16];
  
  pHVar2 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_e8.vals = vals;
  local_d8 = rhs;
  local_d0 = complementation;
  local_c8 = feastol;
  uStack_c0 = in_XMM1_Qb;
  local_a8 = mipsolver;
  local_a0 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (perm,(long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  auVar10 = _DAT_003c57d0;
  auVar9 = _DAT_003c57c0;
  auVar8 = _DAT_003c57b0;
  piVar22 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar18 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  local_90._M_current = piVar22;
  if (piVar22 != piVar18) {
    uVar14 = (long)piVar18 + (-4 - (long)piVar22);
    auVar33._8_4_ = (int)uVar14;
    auVar33._0_8_ = uVar14;
    auVar33._12_4_ = (int)(uVar14 >> 0x20);
    auVar25._0_8_ = uVar14 >> 2;
    auVar25._8_8_ = auVar33._8_8_ >> 2;
    uVar15 = 0;
    auVar25 = auVar25 ^ _DAT_003c57d0;
    do {
      iVar31 = (int)uVar15;
      auVar32._8_4_ = iVar31;
      auVar32._0_8_ = uVar15;
      auVar32._12_4_ = (int)(uVar15 >> 0x20);
      auVar33 = (auVar32 | auVar9) ^ auVar10;
      iVar13 = auVar25._0_4_;
      bVar7 = iVar13 < auVar33._0_4_;
      iVar26 = auVar25._4_4_;
      iVar34 = auVar33._4_4_;
      if ((bool)(~(iVar26 < iVar34 || iVar34 == iVar26 && bVar7) & 1)) {
        piVar22[uVar15] = iVar31;
      }
      if (iVar26 >= iVar34 && (iVar34 != iVar26 || !bVar7)) {
        piVar22[uVar15 + 1] = iVar31 + 1;
      }
      auVar33 = (auVar32 | auVar8) ^ auVar10;
      iVar34 = auVar33._4_4_;
      if (iVar34 <= iVar26 && (iVar34 != iVar26 || auVar33._0_4_ <= iVar13)) {
        piVar22[uVar15 + 2] = iVar31 + 2;
        piVar22[uVar15 + 3] = iVar31 + 3;
      }
      uVar15 = uVar15 + 4;
    } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar15);
    if (piVar22 != piVar18) {
      piVar3 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      lVar17 = *(long *)&(((pHVar2->domain).mipsolver)->model_->integrality_).
                         super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl;
      piVar11 = piVar22;
      piVar19 = piVar18;
      do {
        while( true ) {
          local_90._M_current = piVar11;
          iVar13 = *local_90._M_current;
          lVar20 = (long)piVar3[iVar13];
          if ((((*(char *)(lVar17 + lVar20) == '\0') ||
               (dVar24 = *(double *)
                          (*(long *)&(pHVar2->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          lVar20 * 8), dVar24 != 0.0)) || (NAN(dVar24))) ||
             ((dVar24 = *(double *)
                         (*(long *)&(pHVar2->domain).col_upper_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         lVar20 * 8), dVar24 != 1.0 || (NAN(dVar24))))) break;
          local_90._M_current = local_90._M_current + 1;
          piVar11 = local_90._M_current;
          if (local_90._M_current == piVar19) goto LAB_00262c1e;
        }
        do {
          piVar19 = piVar19 + -1;
          if (local_90._M_current == piVar19) goto LAB_00262c1e;
          lVar20 = (long)piVar3[*piVar19];
        } while (((*(char *)(lVar17 + lVar20) == '\0') ||
                 (dVar24 = *(double *)
                            (*(long *)&(pHVar2->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar20 * 8), dVar24 != 0.0)) ||
                ((NAN(dVar24) ||
                 ((dVar24 = *(double *)
                             (*(long *)&(pHVar2->domain).col_upper_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl
                             + lVar20 * 8), dVar24 != 1.0 || (NAN(dVar24)))))));
        *local_90._M_current = *piVar19;
        *piVar19 = iVar13;
        piVar11 = local_90._M_current + 1;
      } while (piVar19 != local_90._M_current + 1);
      local_90._M_current = local_90._M_current + 1;
    }
  }
LAB_00262c1e:
  local_f0 = (ulong)((long)local_90._M_current - (long)piVar22) >> 2;
  local_b0 = (ulong)((long)piVar18 - (long)piVar22) >> 2;
  iVar13 = (int)local_f0;
  if (iVar13 != 0 && iVar13 < (int)local_b0) {
    local_98 = &pHVar2->implications;
    local_68 = -local_c8;
    uStack_60 = uStack_c0 ^ 0x8000000000000000;
    local_80 = (long)iVar13;
    local_88 = local_f0 & 0xffffffff;
    local_b0 = (ulong)(uint)((int)local_b0 - iVar13);
    uVar14 = 0;
    do {
      iVar13 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start[uVar14];
      local_dc = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar13];
      dVar24 = ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar13];
      local_78 = local_d8 - dVar24;
      local_58 = (-dVar24 - (local_78 - local_d8)) + (local_d8 - (local_78 - (local_78 - local_d8)))
                 + 0.0;
      uStack_50 = 0x8000000000000000;
      uVar15 = local_b0 & 0xffffffff;
      lVar17 = local_80;
      do {
        iVar13 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar17];
        iVar26 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar13];
        lVar20 = (long)iVar26;
        dVar24 = *(double *)
                  (*(long *)&(pHVar2->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar20 * 8);
        pdVar1 = (double *)
                 (*(long *)&(pHVar2->domain).col_upper_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar20 * 8
                 );
        if ((dVar24 != *pdVar1) || (NAN(dVar24) || NAN(*pdVar1))) {
          local_70 = *(double *)
                      (*(long *)&(pHVar2->domain).col_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      lVar20 * 8);
          local_48 = *(double *)
                      (*(long *)&(pHVar2->domain).col_lower_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      lVar20 * 8);
          uStack_40 = 0;
          local_100.hi = local_78;
          local_100.lo = local_58;
          HighsCDouble::operator/=
                    (&local_100,
                     ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar13]);
          dVar24 = local_100.hi;
          dVar27 = local_100.lo;
          if ((local_a8->model_->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20] != kContinuous) {
            dVar24 = floor(local_100.hi + local_100.lo +
                           ((local_a8->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           feastol);
            dVar27 = 0.0;
          }
          dVar30 = local_70 - local_48;
          dVar35 = (-local_48 - (dVar30 - local_70)) + (local_70 - (dVar30 - (dVar30 - local_70))) +
                   0.0;
          dVar28 = dVar30 - local_c8;
          if (dVar24 + dVar27 <
              (local_68 - (dVar28 - dVar30)) + (dVar30 - (dVar28 - (dVar28 - dVar30))) + dVar35 +
              dVar28) {
            piVar3 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar4 = (local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if (pcVar4[piVar3[uVar14]] == -1) {
              dVar29 = dVar30 - dVar24;
              dVar28 = (dVar35 + (-dVar24 - (dVar29 - dVar30)) +
                                 (dVar30 - (dVar29 - (dVar29 - dVar30)))) - dVar27;
            }
            else {
              dVar29 = dVar24 - dVar30;
              dVar28 = (dVar27 + (-dVar30 - (dVar29 - dVar24)) +
                                 (dVar24 - (dVar29 - (dVar29 - dVar24)))) - dVar35;
              dVar24 = dVar30;
              dVar27 = dVar35;
            }
            if (pcVar4[piVar3[lVar17]] == -1) {
              dVar30 = *(double *)
                        (*(long *)&(pHVar2->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar20 * 8);
              uVar16 = (ulong)DAT_003c50b0;
              dVar35 = dVar24 - dVar30;
              HighsImplications::addVLB
                        (local_98,iVar26,local_dc,(double)((ulong)(dVar29 + dVar28) ^ uVar16),
                         (double)((ulong)(dVar27 + (dVar24 - (dVar30 + dVar35)) +
                                                   ((double)((ulong)dVar30 ^ uVar16) -
                                                   (dVar35 - (dVar30 + dVar35))) + dVar35) ^ uVar16)
                        );
            }
            else {
              dVar30 = *(double *)
                        (*(long *)&(pHVar2->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar20 * 8);
              dVar35 = dVar24 + dVar30;
              HighsImplications::addVUB
                        (local_98,iVar26,local_dc,dVar29 + dVar28,
                         dVar27 + (dVar24 - (dVar35 - dVar30)) +
                                  (dVar30 - (dVar35 - (dVar35 - dVar30))) + dVar35);
            }
          }
        }
        lVar17 = lVar17 + 1;
        uVar21 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar21;
      } while (uVar21 != 0);
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_88);
  }
  if (1 < (int)local_f0) {
    begin._M_current =
         (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    if (begin._M_current != local_90._M_current) {
      uVar14 = (long)local_90._M_current - (long)begin._M_current >> 2;
      iVar13 = 0;
      if (1 < uVar14) {
        iVar13 = 0;
        do {
          uVar14 = (long)uVar14 >> 1;
          iVar13 = iVar13 + 1;
        } while (1 < uVar14);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1,false>
                (begin,local_90,local_e8,iVar13,true);
    }
    piVar22 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar1 = ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (local_d8 + local_c8 < pdVar1[*piVar22] + pdVar1[piVar22[1]]) {
      uVar12 = (uint)local_f0;
      uVar21 = uVar12 - 1;
      dVar24 = pdVar1[piVar22[uVar21]];
      if ((local_c8 < ABS(*pdVar1 - dVar24)) || ((dVar24 + dVar24) - local_c8 <= local_d8)) {
        if (uVar21 != 0) {
          uVar14 = (ulong)uVar21;
          do {
            piVar18 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar6 = ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar15 = uVar14;
            piVar22 = piVar18;
            do {
              uVar16 = uVar15 >> 1;
              if ((local_d8 - pdVar6[piVar18[uVar14]]) + local_c8 < pdVar6[piVar22[uVar16]]) {
                piVar22 = piVar22 + uVar16 + 1;
                uVar16 = ~uVar16 + uVar15;
              }
              uVar15 = uVar16;
            } while (0 < (long)uVar16);
            if (piVar22 == piVar18) {
              cVar23 = '\r';
            }
            else {
              pCVar5 = (clique->
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_finish != pCVar5) {
                (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish = pCVar5;
              }
              for (piVar18 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start; piVar18 != piVar22;
                  piVar18 = piVar18 + 1) {
                if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[*piVar18] == -1) {
                  local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
                }
                else {
                  local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
                }
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int&,int>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)clique,
                           (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + *piVar18,(int *)&local_100);
              }
              iVar13 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
              if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar13] == -1) {
                local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
              }
              else {
                local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
              }
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int&,int>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)clique,
                         (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + iVar13,(int *)&local_100);
              cliquevars = (clique->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(clique->
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)cliquevars >> 2;
              if (1 < uVar15) {
                addClique(local_a0,local_a8,cliquevars,(HighsInt)uVar15,false,0x7fffffff);
                cVar23 = '\x01';
                if ((pHVar2->domain).infeasible_ != false) goto LAB_0026330c;
              }
              cVar23 = piVar22 ==
                       (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar14;
            }
LAB_0026330c:
          } while (((cVar23 == '\r') || (cVar23 == '\0')) && (uVar14 = uVar14 - 1, (int)uVar14 != 0)
                  );
        }
      }
      else {
        pCVar5 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_finish != pCVar5) {
          (clique->
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          )._M_impl.super__Vector_impl_data._M_finish = pCVar5;
        }
        uVar14 = 0;
        do {
          iVar13 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
          if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar13] == -1) {
            local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
          }
          else {
            local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
          }
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<int&,int>
                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      *)clique,
                     (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + iVar13,(int *)&local_100);
          uVar14 = uVar14 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar14);
        addClique(local_a0,local_a8,
                  (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start,(HighsInt)local_f0,false,0x7fffffff);
      }
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(
    const HighsMipSolver& mipsolver, std::vector<HighsInt>& inds,
    std::vector<double>& vals, std::vector<int8_t>& complementation, double rhs,
    HighsInt nbin, std::vector<HighsInt>& perm, std::vector<CliqueVar>& clique,
    double feastol) {
  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  perm.resize(inds.size());
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });
  nbin = binaryend - perm.begin();
  HighsInt ntotal = (HighsInt)perm.size();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint
  if (nbin < ntotal) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedub = HighsCDouble(rhs) - vals[perm[i]];
      for (HighsInt j = nbin; j != ntotal; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        HighsCDouble colub =
            HighsCDouble(globaldom.col_upper_[col]) - globaldom.col_lower_[col];
        HighsCDouble implcolub = impliedub / vals[perm[j]];
        if (mipsolver.variableType(col) != HighsVarType::kContinuous)
          implcolub =
              std::floor(double(implcolub) + mipsolver.mipdata_->feastol);

        if (implcolub < colub - feastol) {
          HighsCDouble coef;
          HighsCDouble constant;

          if (complementation[perm[i]] == -1) {
            coef = colub - implcolub;
            constant = implcolub;
          } else {
            coef = implcolub - colub;
            constant = colub;
          }

          if (complementation[perm[j]] == -1) {
            constant -= globaldom.col_upper_[col];
            implics.addVLB(col, bincol, -double(coef), -double(constant));
          } else {
            constant += globaldom.col_lower_[col];
            implics.addVUB(col, bincol, double(coef), double(constant));
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(vals[p1], p1) > std::make_pair(vals[p2], p2);
  });
  // check if any cliques exists
  if (vals[perm[0]] + vals[perm[1]] <= rhs + feastol) return;

  // check if this is a set packing constraint (or easily transformable
  // into one)
  if (std::abs(vals[0] - vals[perm[nbin - 1]]) <= feastol &&
      rhs < 2 * vals[perm[nbin - 1]] - feastol) {
    // the coefficients on the binary variables are all equal and the
    // right hand side is strictly below two times the coefficient value.
    // Therefore the constraint can be transformed into a set packing
    // constraint by relaxing out all non-binary variables (if any),
    // dividing by the coefficient value of the binary variables, and then
    // possibly rounding down the right hand side
    clique.clear();

    for (auto j = 0; j != nbin; ++j) {
      HighsInt pos = perm[j];
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    addClique(mipsolver, clique.data(), nbin);
    if (globaldom.infeasible()) return;
    // printf("extracted this clique:\n");
    // printClique(clique);
    return;
  }

  for (HighsInt k = nbin - 1; k != 0; --k) {
    double mincliqueval = rhs - vals[perm[k]] + feastol;
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return vals[p] > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (complementation[perm[k]] == -1)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);

    if (clique.size() >= 2) {
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);
      // runCliqueMerging(globaldom, clique);
      // if (clique.size() >= 2) {
      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible()) return;
      //}
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}